

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O3

REF_STATUS ref_interp_seed_tree(REF_INTERP ref_interp)

{
  size_t sVar1;
  double dVar2;
  double dVar3;
  REF_INT RVar4;
  REF_MPI pRVar5;
  REF_NODE pRVar6;
  REF_CELL pRVar7;
  REF_NODE pRVar8;
  REF_SEARCH pRVar9;
  REF_GLOB *pRVar10;
  undefined1 auVar11 [16];
  uint uVar12;
  void *my_array;
  void *my_array_00;
  REF_DBL *pRVar13;
  REF_DBL *pRVar14;
  REF_INT *pRVar15;
  ulong uVar16;
  long lVar17;
  undefined8 uVar18;
  long lVar19;
  undefined8 *puVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  void *pvVar24;
  REF_INT RVar25;
  char *pcVar26;
  uint uVar27;
  int iVar29;
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  int iVar33;
  REF_INT total_node;
  REF_INTERP local_188;
  REF_MPI local_180;
  REF_INT *local_178;
  REF_INT *local_170;
  void *local_168;
  REF_DBL *local_160;
  REF_SEARCH local_158;
  REF_INT nrecv;
  REF_DBL *local_148;
  REF_INT *source;
  REF_DBL *global_xyz;
  REF_LIST ref_list;
  void *local_128;
  void *local_120;
  void *local_118;
  uint local_10c;
  ulong local_108;
  REF_DBL *recv_bary;
  REF_INT *recv_node;
  REF_INT *recv_cell;
  REF_INT *recv_proc;
  REF_INT *global_node;
  REF_NODE local_d8;
  REF_CELL local_d0;
  REF_DBL bary [4];
  REF_INT nodes [27];
  
  pRVar5 = ref_interp->ref_mpi;
  pRVar6 = ref_interp->from_grid->node;
  pRVar7 = ref_interp->from_tet;
  pRVar8 = ref_interp->to_grid->node;
  pRVar9 = ref_interp->ref_search;
  uVar12 = ref_list_create(&ref_list);
  if (uVar12 == 0) {
    iVar29 = pRVar8->max;
    uVar22 = (ulong)iVar29;
    local_188 = ref_interp;
    local_158 = pRVar9;
    local_d0 = pRVar7;
    if ((long)uVar22 < 1) {
      uVar12 = 0;
    }
    else {
      uVar16 = 0;
      uVar12 = 0;
      do {
        if ((-1 < pRVar8->global[uVar16]) && (pRVar8->ref_mpi->id == pRVar8->part[uVar16])) {
          uVar12 = uVar12 + (ref_interp->cell[uVar16] == -1);
        }
        uVar16 = uVar16 + 1;
      } while (uVar22 != uVar16);
      if ((int)uVar12 < 0) {
        pcVar26 = "malloc local_node of REF_INT negative";
        uVar18 = 0x617;
        goto LAB_0015f06b;
      }
    }
    local_d8 = pRVar6;
    my_array = malloc((ulong)uVar12 << 2);
    if (my_array == (void *)0x0) {
      pcVar26 = "malloc local_node of REF_INT NULL";
      uVar18 = 0x617;
LAB_0015f20e:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             uVar18,"ref_interp_seed_tree",pcVar26);
      return 2;
    }
    my_array_00 = malloc((ulong)(uVar12 * 3) << 3);
    if (my_array_00 == (void *)0x0) {
      pcVar26 = "malloc local_xyz of REF_DBL NULL";
      uVar18 = 0x618;
      goto LAB_0015f20e;
    }
    if (iVar29 < 1) {
      uVar27 = 0;
    }
    else {
      pRVar10 = pRVar8->global;
      uVar16 = 0;
      lVar19 = 2;
      uVar27 = 0;
      do {
        if (((-1 < pRVar10[uVar16]) && (pRVar8->ref_mpi->id == pRVar8->part[uVar16])) &&
           (ref_interp->cell[uVar16] == -1)) {
          *(int *)((long)my_array + (long)(int)uVar27 * 4) = (int)uVar16;
          pRVar13 = pRVar8->real;
          lVar23 = (long)(int)(uVar27 * 3);
          *(REF_DBL *)((long)my_array_00 + lVar23 * 8) = pRVar13[lVar19 + -2];
          *(REF_DBL *)((long)my_array_00 + lVar23 * 8 + 8) = pRVar13[lVar19 + -1];
          *(REF_DBL *)((long)my_array_00 + lVar23 * 8 + 0x10) = pRVar13[lVar19];
          uVar27 = uVar27 + 1;
        }
        uVar16 = uVar16 + 1;
        lVar19 = lVar19 + 0xf;
      } while (uVar16 < uVar22);
      if (0 < (int)uVar27) {
        uVar12 = 10;
        if (10 < uVar27 / 100) {
          uVar12 = uVar27 / 100;
        }
        if (uVar27 <= uVar12) {
          uVar12 = uVar27;
        }
        uVar22 = 100;
        if (uVar12 < 100) {
          uVar22 = (ulong)uVar12;
        }
        lVar19 = 0;
        puVar20 = (undefined8 *)((long)my_array_00 + 0x10);
        lVar23 = 0;
        do {
          *(undefined4 *)((long)my_array + lVar19 * 4) =
               *(undefined4 *)((long)my_array + lVar23 * 4);
          puVar20[-2] = *(undefined8 *)((long)my_array_00 + lVar23 * 0x18);
          puVar20[-1] = *(undefined8 *)((long)my_array_00 + lVar23 * 0x18 + 8);
          *puVar20 = *(undefined8 *)((long)my_array_00 + lVar23 * 0x18 + 0x10);
          lVar19 = lVar19 + 1;
          lVar23 = lVar23 + (ulong)((int)(uVar27 / uVar22) + 1);
          puVar20 = puVar20 + 3;
        } while ((int)lVar23 < (int)uVar27);
        uVar27 = (uint)lVar19;
      }
    }
    local_180 = pRVar5;
    uVar12 = ref_mpi_allconcat(pRVar5,3,uVar27,my_array_00,&total_node,&source,&global_xyz,3);
    if (uVar12 == 0) {
      if (source != (REF_INT *)0x0) {
        free(source);
      }
      uVar12 = ref_mpi_allconcat(local_180,1,uVar27,my_array,&total_node,&source,&global_node,1);
      RVar25 = total_node;
      if (uVar12 == 0) {
        lVar19 = (long)total_node;
        if (lVar19 < 0) {
          pcVar26 = "malloc best_bary of REF_DBL negative";
          uVar18 = 0x63f;
LAB_0015f06b:
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 uVar18,"ref_interp_seed_tree",pcVar26);
          return 1;
        }
        pRVar13 = (REF_DBL *)malloc(lVar19 * 8);
        if (pRVar13 == (REF_DBL *)0x0) {
          pcVar26 = "malloc best_bary of REF_DBL NULL";
          uVar18 = 0x63f;
          goto LAB_0015f20e;
        }
        sVar1 = lVar19 * 4;
        local_118 = malloc(sVar1);
        if (local_118 == (void *)0x0) {
          pcVar26 = "malloc best_node of REF_INT NULL";
          uVar18 = 0x640;
          goto LAB_0015f20e;
        }
        pRVar14 = (REF_DBL *)malloc(sVar1);
        if (pRVar14 == (REF_DBL *)0x0) {
          pcVar26 = "malloc best_cell of REF_INT NULL";
          uVar18 = 0x641;
          goto LAB_0015f20e;
        }
        local_148 = pRVar14;
        pRVar15 = (REF_INT *)malloc(sVar1);
        if (pRVar15 == (REF_INT *)0x0) {
          pcVar26 = "malloc from_proc of REF_INT NULL";
          uVar18 = 0x642;
          goto LAB_0015f20e;
        }
        if (RVar25 == 0) {
          RVar25 = 0;
        }
        else {
          pvVar24 = (void *)0x0;
          lVar19 = 0;
          pRVar14 = local_148;
          local_170 = pRVar15;
          local_160 = pRVar13;
          do {
            *(REF_INT *)((long)local_118 + lVar19 * 4) = global_node[lVar19];
            *(undefined4 *)pRVar14 = 0xffffffff;
            local_160[lVar19] = 1e+20;
            local_168 = pvVar24;
            uVar12 = ref_search_touching(local_158,ref_list,
                                         (REF_DBL *)((long)global_xyz + (long)pvVar24),
                                         ref_interp->search_fuzz);
            if (uVar12 != 0) {
              pcVar26 = "tch";
              uVar18 = 0x649;
              goto LAB_0015efd6;
            }
            if (ref_list->n < 1) {
              *(undefined4 *)pRVar14 = 0xffffffff;
            }
            else {
              uVar12 = ref_interp_enclosing_tet_in_list
                                 ((REF_INTERP)ref_interp->from_grid->node,
                                  (REF_LIST)ref_interp->from_tet,(REF_DBL *)ref_list,
                                  (REF_INT *)((long)global_xyz + (long)local_168),pRVar14);
              if (uVar12 != 0) {
                pcVar26 = "best in list";
                uVar18 = 0x64e;
                goto LAB_0015efd6;
              }
              if (*(int *)pRVar14 != -1) {
                dVar2 = bary[0];
                if (bary[1] <= bary[0]) {
                  dVar2 = bary[1];
                }
                dVar3 = bary[2];
                if (bary[3] <= bary[2]) {
                  dVar3 = bary[3];
                }
                if (dVar3 <= dVar2) {
                  dVar2 = dVar3;
                }
                local_160[lVar19] = -dVar2;
              }
            }
            ref_interp->tree_cells = ref_interp->tree_cells + ref_list->n;
            uVar12 = ref_list_erase(ref_list);
            if (uVar12 != 0) {
              pcVar26 = "reset list";
              uVar18 = 0x657;
              goto LAB_0015efd6;
            }
            lVar19 = lVar19 + 1;
            pvVar24 = (void *)((long)local_168 + 0x18);
            pRVar14 = (REF_DBL *)((long)pRVar14 + 4);
            pRVar15 = local_170;
            pRVar13 = local_160;
            RVar25 = total_node;
          } while (lVar19 < total_node);
        }
        pRVar5 = local_180;
        uVar12 = ref_mpi_allminwho(local_180,pRVar13,pRVar15,RVar25);
        RVar25 = total_node;
        if (uVar12 == 0) {
          uVar22 = (ulong)total_node;
          if ((long)uVar22 < 1) {
            uVar12 = 0;
          }
          else {
            uVar16 = 0;
            uVar12 = 0;
            do {
              uVar12 = uVar12 + (pRVar5->id == pRVar15[uVar16]);
              uVar16 = uVar16 + 1;
            } while (uVar22 != uVar16);
          }
          local_170 = pRVar15;
          local_160 = pRVar13;
          local_158 = (REF_SEARCH)malloc((ulong)(uVar12 * 4) << 3);
          if (local_158 == (REF_SEARCH)0x0) {
            pcVar26 = "malloc send_bary of REF_DBL NULL";
            uVar18 = 0x661;
            goto LAB_0015f20e;
          }
          uVar16 = (ulong)uVar12;
          sVar1 = uVar16 * 4;
          local_168 = malloc(sVar1);
          if (local_168 == (void *)0x0) {
            pcVar26 = "malloc send_cell of REF_INT NULL";
            uVar18 = 0x662;
            goto LAB_0015f20e;
          }
          local_120 = malloc(sVar1);
          if (local_120 == (void *)0x0) {
            pcVar26 = "malloc send_node of REF_INT NULL";
            uVar18 = 0x663;
            goto LAB_0015f20e;
          }
          local_178 = (REF_INT *)malloc(sVar1);
          if (local_178 == (REF_INT *)0x0) {
            pcVar26 = "malloc send_proc of REF_INT NULL";
            uVar18 = 0x664;
            goto LAB_0015f20e;
          }
          local_128 = malloc(sVar1);
          auVar11 = _DAT_002111c0;
          if (local_128 == (void *)0x0) {
            pcVar26 = "malloc my_proc of REF_INT NULL";
            uVar18 = 0x665;
            local_128 = (void *)0x0;
            goto LAB_0015f20e;
          }
          if (uVar12 != 0) {
            RVar4 = local_180->id;
            lVar19 = uVar16 - 1;
            auVar28._8_4_ = (int)lVar19;
            auVar28._0_8_ = lVar19;
            auVar28._12_4_ = (int)((ulong)lVar19 >> 0x20);
            uVar21 = 0;
            auVar28 = auVar28 ^ _DAT_002111c0;
            auVar30 = _DAT_002111a0;
            auVar31 = _DAT_002111b0;
            do {
              auVar32 = auVar31 ^ auVar11;
              iVar29 = auVar28._4_4_;
              if ((bool)(~(auVar32._4_4_ == iVar29 && auVar28._0_4_ < auVar32._0_4_ ||
                          iVar29 < auVar32._4_4_) & 1)) {
                *(REF_INT *)((long)local_128 + uVar21) = RVar4;
              }
              if ((auVar32._12_4_ != auVar28._12_4_ || auVar32._8_4_ <= auVar28._8_4_) &&
                  auVar32._12_4_ <= auVar28._12_4_) {
                *(REF_INT *)((long)local_128 + uVar21 + 4) = RVar4;
              }
              auVar32 = auVar30 ^ auVar11;
              iVar33 = auVar32._4_4_;
              if (iVar33 <= iVar29 && (iVar33 != iVar29 || auVar32._0_4_ <= auVar28._0_4_)) {
                *(REF_INT *)((long)local_128 + uVar21 + 8) = RVar4;
                *(REF_INT *)((long)local_128 + uVar21 + 0xc) = RVar4;
              }
              lVar19 = auVar31._8_8_;
              auVar31._0_8_ = auVar31._0_8_ + 4;
              auVar31._8_8_ = lVar19 + 4;
              lVar19 = auVar30._8_8_;
              auVar30._0_8_ = auVar30._0_8_ + 4;
              auVar30._8_8_ = lVar19 + 4;
              uVar21 = uVar21 + 0x10;
            } while ((uVar16 * 4 + 0xc & 0xfffffffffffffff0) != uVar21);
          }
          if (RVar25 < 1) {
            uVar16 = 0;
          }
          else {
            lVar19 = 0;
            lVar23 = 0;
            uVar16 = 0;
            pRVar13 = local_148;
            pRVar15 = local_170;
            do {
              if (local_180->id == pRVar15[lVar23]) {
                lVar17 = (long)(int)uVar16;
                local_178[lVar17] = source[lVar23];
                local_10c = *(uint *)((long)local_118 + lVar23 * 4);
                *(uint *)((long)local_120 + lVar17 * 4) = local_10c;
                uVar12 = *(uint *)((long)pRVar13 + lVar23 * 4);
                *(uint *)((long)local_168 + lVar17 * 4) = uVar12;
                if (uVar12 != 0xffffffff) {
                  local_108 = uVar16;
                  uVar27 = ref_cell_nodes(local_d0,uVar12,nodes);
                  if (uVar27 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                           ,0x671,"ref_interp_seed_tree",(ulong)uVar27,
                           "cell should be set and valid");
                    printf("global %d best cell %d best bary %e\n",local_160[lVar23],
                           (ulong)local_10c,(ulong)uVar12);
                    return uVar27;
                  }
                  uVar12 = ref_node_bary4(local_d8,nodes,(REF_DBL *)((long)global_xyz + lVar19),
                                          (REF_DBL *)
                                          (&local_158->d + (long)((int)local_108 * 4) * 2));
                  if (uVar12 != 0) {
                    uVar22 = (ulong)uVar12;
                    pcVar26 = "bary";
                    uVar18 = 0x674;
                    goto LAB_0015efdb;
                  }
                  uVar22 = (ulong)(uint)total_node;
                  pRVar13 = local_148;
                  uVar16 = local_108;
                  pRVar15 = local_170;
                }
                uVar16 = (ulong)((int)uVar16 + 1);
              }
              lVar23 = lVar23 + 1;
              lVar19 = lVar19 + 0x18;
            } while (lVar23 < (int)uVar22);
          }
          RVar25 = (REF_INT)uVar16;
          uVar12 = ref_mpi_blindsend(local_180,local_178,local_120,1,RVar25,&recv_node,&nrecv,1);
          if (uVar12 == 0) {
            uVar12 = ref_mpi_blindsend(local_180,local_178,local_168,1,RVar25,&recv_cell,&nrecv,1);
            if (uVar12 == 0) {
              uVar12 = ref_mpi_blindsend(local_180,local_178,local_128,1,RVar25,&recv_proc,&nrecv,1)
              ;
              if (uVar12 == 0) {
                uVar12 = ref_mpi_blindsend(local_180,local_178,local_158,4,RVar25,&recv_bary,&nrecv,
                                           3);
                if (uVar12 == 0) {
                  if (0 < nrecv) {
                    lVar23 = 0;
                    lVar19 = 0;
                    do {
                      local_188->n_tree = local_188->n_tree + 1;
                      iVar29 = recv_node[lVar19];
                      pRVar15 = local_188->cell;
                      if ((long)pRVar15[iVar29] != -1) {
                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                               ,0x689,"ref_interp_seed_tree","tree already found?",
                               0xffffffffffffffff,(long)pRVar15[iVar29]);
                        return 1;
                      }
                      if (local_188->agent_hired[iVar29] != 0) {
                        uVar12 = ref_agents_delete(local_188->ref_agents,iVar29);
                        if (uVar12 != 0) {
                          uVar22 = (ulong)uVar12;
                          pcVar26 = "deq";
                          uVar18 = 0x68b;
                          goto LAB_0015efdb;
                        }
                        local_188->agent_hired[iVar29] = 0;
                        pRVar15 = local_188->cell;
                      }
                      pRVar15[iVar29] = recv_cell[lVar19];
                      local_188->part[iVar29] = recv_proc[lVar19];
                      if (recv_cell[lVar19] == -1) {
                        local_188->n_tree = local_188->n_tree + -1;
                      }
                      else {
                        pRVar13 = local_188->bary;
                        lVar17 = 0;
                        do {
                          pRVar13[iVar29 * 4 + lVar17] =
                               *(REF_DBL *)((long)recv_bary + lVar17 * 8 + lVar23);
                          lVar17 = lVar17 + 1;
                        } while (lVar17 != 4);
                        uVar12 = ref_interp_push_onto_queue(local_188,iVar29);
                        if (uVar12 != 0) {
                          uVar22 = (ulong)uVar12;
                          pcVar26 = "queue neighbors";
                          uVar18 = 0x693;
                          goto LAB_0015efdb;
                        }
                      }
                      lVar19 = lVar19 + 1;
                      lVar23 = lVar23 + 0x20;
                    } while (lVar19 < nrecv);
                  }
                  if (recv_node != (REF_INT *)0x0) {
                    free(recv_node);
                  }
                  if (recv_cell != (REF_INT *)0x0) {
                    free(recv_cell);
                  }
                  if (recv_proc != (REF_INT *)0x0) {
                    free(recv_proc);
                  }
                  if (recv_bary != (REF_DBL *)0x0) {
                    free(recv_bary);
                  }
                  free(local_158);
                  free(local_128);
                  free(local_168);
                  free(local_120);
                  free(local_178);
                  free(local_170);
                  free(local_148);
                  free(local_118);
                  free(local_160);
                  if (source != (REF_INT *)0x0) {
                    free(source);
                  }
                  if (global_node != (REF_INT *)0x0) {
                    free(global_node);
                  }
                  if (global_xyz != (REF_DBL *)0x0) {
                    free(global_xyz);
                  }
                  free(my_array_00);
                  free(my_array);
                  uVar12 = ref_list_free(ref_list);
                  if (uVar12 == 0) {
                    return 0;
                  }
                  pcVar26 = "free list";
                  uVar18 = 0x6af;
                  uVar22 = (ulong)uVar12;
                }
                else {
                  uVar22 = (ulong)uVar12;
                  pcVar26 = "blind send bary";
                  uVar18 = 0x684;
                }
              }
              else {
                uVar22 = (ulong)uVar12;
                pcVar26 = "blind send proc";
                uVar18 = 0x681;
              }
            }
            else {
              uVar22 = (ulong)uVar12;
              pcVar26 = "blind send cell";
              uVar18 = 0x67e;
            }
          }
          else {
            uVar22 = (ulong)uVar12;
            pcVar26 = "blind send node";
            uVar18 = 0x67b;
          }
          goto LAB_0015efdb;
        }
        pcVar26 = "who";
        uVar18 = 0x65b;
      }
      else {
        pcVar26 = "cat";
        uVar18 = 0x63d;
      }
    }
    else {
      pcVar26 = "cat";
      uVar18 = 0x639;
    }
  }
  else {
    pcVar26 = "create list";
    uVar18 = 0x60f;
  }
LAB_0015efd6:
  uVar22 = (ulong)uVar12;
LAB_0015efdb:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar18,
         "ref_interp_seed_tree",uVar22,pcVar26);
  return (REF_STATUS)uVar22;
}

Assistant:

REF_FCN static REF_STATUS ref_interp_seed_tree(REF_INTERP ref_interp) {
  REF_GRID from_grid = ref_interp_from_grid(ref_interp);
  REF_GRID to_grid = ref_interp_to_grid(ref_interp);
  REF_MPI ref_mpi = ref_interp_mpi(ref_interp);
  REF_NODE from_node = ref_grid_node(from_grid);
  REF_CELL from_tet = ref_interp_from_tet(ref_interp);
  REF_NODE to_node = ref_grid_node(to_grid);
  REF_SEARCH ref_search = ref_interp_search(ref_interp);
  REF_DBL bary[4];
  REF_LIST ref_list;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT node, *best_node, *best_cell, *from_proc;
  REF_DBL *best_bary;
  REF_INT ntarget, seed_target, stride;
  REF_DBL *local_xyz, *global_xyz;
  REF_INT *local_node, *global_node;
  REF_INT *source, total_node;
  REF_INT nsend, nrecv;
  REF_INT *send_proc, *my_proc, *recv_proc;
  REF_INT *send_cell, *recv_cell;
  REF_INT *send_node, *recv_node;
  REF_DBL *send_bary, *recv_bary;
  REF_INT i, item;

  RSS(ref_list_create(&ref_list), "create list");

  ntarget = 0;
  each_ref_node_valid_node(to_node, node) {
    if (!ref_node_owned(to_node, node) || REF_EMPTY != ref_interp->cell[node])
      continue;
    ntarget++;
  }
  ref_malloc(local_node, ntarget, REF_INT);
  ref_malloc(local_xyz, 3 * ntarget, REF_DBL);
  ntarget = 0;
  each_ref_node_valid_node(to_node, node) {
    if (!ref_node_owned(to_node, node) || REF_EMPTY != ref_interp->cell[node])
      continue;
    local_node[ntarget] = node;
    local_xyz[0 + 3 * ntarget] = ref_node_xyz(to_node, 0, node);
    local_xyz[1 + 3 * ntarget] = ref_node_xyz(to_node, 1, node);
    local_xyz[2 + 3 * ntarget] = ref_node_xyz(to_node, 2, node);
    ntarget++;
  }

  /* use approximately 1 percent of existing targets sampled uniformly,
     between 10 or 100, less than or equal ntarget */
  seed_target = ntarget / 100;
  seed_target = MAX(seed_target, 10);
  seed_target = MIN(seed_target, 100);
  seed_target = MIN(seed_target, ntarget);
  if (seed_target > 0) {
    stride = 1 + ntarget / seed_target;
    seed_target = 0;
    for (node = 0; node < ntarget; node += stride) {
      local_node[seed_target] = local_node[node];
      local_xyz[0 + 3 * seed_target] = local_xyz[0 + 3 * node];
      local_xyz[1 + 3 * seed_target] = local_xyz[1 + 3 * node];
      local_xyz[2 + 3 * seed_target] = local_xyz[2 + 3 * node];
      seed_target++;
    }
    ntarget = seed_target;
  }

  RSS(ref_mpi_allconcat(ref_mpi, 3, ntarget, (void *)local_xyz, &total_node,
                        &source, (void **)&global_xyz, REF_DBL_TYPE),
      "cat");
  ref_free(source);
  RSS(ref_mpi_allconcat(ref_mpi, 1, ntarget, (void *)local_node, &total_node,
                        &source, (void **)&global_node, REF_INT_TYPE),
      "cat");

  ref_malloc(best_bary, total_node, REF_DBL);
  ref_malloc(best_node, total_node, REF_INT);
  ref_malloc(best_cell, total_node, REF_INT);
  ref_malloc(from_proc, total_node, REF_INT);
  for (node = 0; node < total_node; node++) {
    best_node[node] = global_node[node];
    best_cell[node] = REF_EMPTY;
    best_bary[node] = 1.0e20; /* negative for min, until use max*/
    RSS(ref_search_touching(ref_search, ref_list, &(global_xyz[3 * node]),
                            ref_interp_search_fuzz(ref_interp)),
        "tch");
    if (ref_list_n(ref_list) > 0) {
      RSS(ref_interp_enclosing_tet_in_list(ref_interp, ref_list,
                                           &(global_xyz[3 * node]),
                                           &(best_cell[node]), bary),
          "best in list");
      if (REF_EMPTY != best_cell[node]) {
        /* negative for min, until use max*/
        best_bary[node] = -MIN(MIN(bary[0], bary[1]), MIN(bary[2], bary[3]));
      }
    } else {
      best_cell[node] = REF_EMPTY;
    }
    (ref_interp->tree_cells) += ref_list_n(ref_list);
    RSS(ref_list_erase(ref_list), "reset list");
  }

  /* negative for min, until use max*/
  RSS(ref_mpi_allminwho(ref_mpi, best_bary, from_proc, total_node), "who");

  nsend = 0;
  for (node = 0; node < total_node; node++)
    if (ref_mpi_rank(ref_mpi) == from_proc[node]) nsend++;

  ref_malloc(send_bary, 4 * nsend, REF_DBL);
  ref_malloc(send_cell, nsend, REF_INT);
  ref_malloc(send_node, nsend, REF_INT);
  ref_malloc(send_proc, nsend, REF_INT);
  ref_malloc_init(my_proc, nsend, REF_INT, ref_mpi_rank(ref_mpi));
  nsend = 0;
  for (node = 0; node < total_node; node++)
    if (ref_mpi_rank(ref_mpi) == from_proc[node]) {
      send_proc[nsend] = source[node];
      send_node[nsend] = best_node[node];
      send_cell[nsend] = best_cell[node];
      if (REF_EMPTY != send_cell[nsend]) {
        RSB(ref_cell_nodes(from_tet, best_cell[node], nodes),
            "cell should be set and valid", {
              printf("global %d best cell %d best bary %e\n", best_node[node],
                     best_cell[node], best_bary[node]);
            });
        RSS(ref_node_bary4(from_node, nodes, &(global_xyz[3 * node]),
                           &(send_bary[4 * nsend])),
            "bary");
      }
      nsend++;
    }

  RSS(ref_mpi_blindsend(ref_mpi, send_proc, (void *)send_node, 1, nsend,
                        (void **)(&recv_node), &nrecv, REF_INT_TYPE),
      "blind send node");
  RSS(ref_mpi_blindsend(ref_mpi, send_proc, (void *)send_cell, 1, nsend,
                        (void **)(&recv_cell), &nrecv, REF_INT_TYPE),
      "blind send cell");
  RSS(ref_mpi_blindsend(ref_mpi, send_proc, (void *)my_proc, 1, nsend,
                        (void **)(&recv_proc), &nrecv, REF_INT_TYPE),
      "blind send proc");
  RSS(ref_mpi_blindsend(ref_mpi, send_proc, (void *)send_bary, 4, nsend,
                        (void **)(&recv_bary), &nrecv, REF_DBL_TYPE),
      "blind send bary");

  for (item = 0; item < nrecv; item++) {
    (ref_interp->n_tree)++;
    node = recv_node[item];
    REIS(REF_EMPTY, ref_interp->cell[node], "tree already found?");
    if (ref_interp->agent_hired[node]) { /* need to dequeue */
      RSS(ref_agents_delete(ref_interp->ref_agents, node), "deq");
      ref_interp->agent_hired[node] = REF_FALSE;
    }
    ref_interp->cell[node] = recv_cell[item];
    ref_interp->part[node] = recv_proc[item];
    if (REF_EMPTY != recv_cell[item]) {
      for (i = 0; i < 4; i++)
        ref_interp->bary[i + 4 * node] = recv_bary[i + 4 * item];
      RSS(ref_interp_push_onto_queue(ref_interp, node), "queue neighbors");
    } else {
      (ref_interp->n_tree)--;
    }
  }

  ref_free(recv_node);
  ref_free(recv_cell);
  ref_free(recv_proc);
  ref_free(recv_bary);

  ref_free(send_bary);
  ref_free(my_proc);
  ref_free(send_cell);
  ref_free(send_node);
  ref_free(send_proc);

  ref_free(from_proc);
  ref_free(best_cell);
  ref_free(best_node);
  ref_free(best_bary);

  ref_free(source);
  ref_free(global_node);
  ref_free(global_xyz);
  ref_free(local_xyz);
  ref_free(local_node);

  RSS(ref_list_free(ref_list), "free list");

  return REF_SUCCESS;
}